

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndFrame(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVector<ImGuiWindow_*> *this_00;
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  _func_void_int_int *p_Var5;
  ImVec2 IVar6;
  bool bVar7;
  ImGuiContext *pIVar8;
  value_type *ppIVar9;
  ImGuiWindow *pIVar10;
  int i;
  int iVar11;
  float fVar12;
  float fVar13;
  
  pIVar8 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xff1,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    p_Var5 = (GImGui->IO).ImeSetInputScreenPosFn;
    if (p_Var5 != (_func_void_int_int *)0x0) {
      fVar1 = (GImGui->PlatformImePos).x;
      fVar2 = (GImGui->PlatformImePos).y;
      fVar12 = (GImGui->PlatformImeLastPos).x - fVar1;
      fVar13 = (GImGui->PlatformImeLastPos).y - fVar2;
      if (0.0001 < fVar12 * fVar12 + fVar13 * fVar13) {
        (*p_Var5)((int)fVar1,(int)fVar2);
        pIVar8->PlatformImeLastPos = pIVar8->PlatformImePos;
      }
    }
    if ((pIVar8->CurrentWindowStack).Size != 1) {
      __assert_fail("g.CurrentWindowStack.Size == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xffd,"void ImGui::EndFrame()");
    }
    pIVar10 = pIVar8->CurrentWindow;
    if ((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->WriteAccessed == false)) {
      pIVar10->Active = false;
    }
    End();
    if (((pIVar8->ActiveId == 0) && (pIVar8->HoveredId == 0)) &&
       ((pIVar10 = pIVar8->NavWindow, pIVar10 == (ImGuiWindow *)0x0 || (pIVar10->Appearing == false)
        ))) {
      if ((pIVar8->IO).MouseClicked[0] == true) {
        if (pIVar8->HoveredRootWindow == (ImGuiWindow *)0x0) {
          if ((pIVar10 != (ImGuiWindow *)0x0) &&
             (pIVar10 = GetFrontMostPopupModal(), pIVar10 == (ImGuiWindow *)0x0)) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
        else {
          FocusWindow(pIVar8->HoveredWindow);
          SetActiveID(pIVar8->HoveredWindow->MoveId,pIVar8->HoveredWindow);
          pIVar8->NavDisableHighlight = true;
          IVar3 = (pIVar8->IO).MousePos;
          IVar4 = pIVar8->HoveredRootWindow->Pos;
          IVar6.y = IVar3.y - IVar4.y;
          IVar6.x = IVar3.x - IVar4.x;
          pIVar8->ActiveIdClickOffset = IVar6;
          if (((pIVar8->HoveredWindow->Flags & 4) == 0) &&
             ((pIVar8->HoveredRootWindow->Flags & 4) == 0)) {
            pIVar8->MovingWindow = pIVar8->HoveredWindow;
          }
        }
      }
      if ((pIVar8->IO).MouseClicked[1] == true) {
        pIVar10 = GetFrontMostPopupModal();
        iVar11 = (pIVar8->Windows).Size;
        bVar7 = pIVar10 == (ImGuiWindow *)0x0;
        while ((0 < iVar11 && (!bVar7))) {
          iVar11 = iVar11 + -1;
          ppIVar9 = ImVector<ImGuiWindow_*>::operator[](&pIVar8->Windows,iVar11);
          if (*ppIVar9 == pIVar10) break;
          if (*ppIVar9 == pIVar8->HoveredWindow) {
            bVar7 = true;
          }
        }
        if (bVar7) {
          pIVar10 = pIVar8->HoveredWindow;
        }
        ClosePopupsOverWindow(pIVar10);
      }
    }
    this = &pIVar8->WindowsSortBuffer;
    ImVector<ImGuiWindow_*>::resize(this,0);
    this_00 = &pIVar8->Windows;
    ImVector<ImGuiWindow_*>::reserve(this,(pIVar8->Windows).Size);
    for (iVar11 = 0; iVar11 != this_00->Size; iVar11 = iVar11 + 1) {
      ppIVar9 = ImVector<ImGuiWindow_*>::operator[](this_00,iVar11);
      pIVar10 = *ppIVar9;
      if ((pIVar10->Active != true) || ((pIVar10->Flags & 0x1000000) == 0)) {
        AddWindowToSortedBuffer(this,pIVar10);
      }
    }
    if (this->Size != iVar11) {
      __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x103d,"void ImGui::EndFrame()");
    }
    ImVector<ImGuiWindow_*>::swap(this_00,this);
    (pIVar8->IO).MouseWheel = 0.0;
    (pIVar8->IO).MouseWheelH = 0.0;
    (pIVar8->IO).InputCharacters[0] = 0;
    (pIVar8->IO).InputCharacters[1] = 0;
    (pIVar8->IO).InputCharacters[2] = 0;
    (pIVar8->IO).InputCharacters[3] = 0;
    (pIVar8->IO).InputCharacters[4] = 0;
    (pIVar8->IO).InputCharacters[5] = 0;
    (pIVar8->IO).InputCharacters[6] = 0;
    (pIVar8->IO).InputCharacters[7] = 0;
    (pIVar8->IO).InputCharacters[8] = 0;
    (pIVar8->IO).InputCharacters[9] = 0;
    (pIVar8->IO).InputCharacters[10] = 0;
    (pIVar8->IO).InputCharacters[0xb] = 0;
    (pIVar8->IO).InputCharacters[0xc] = 0;
    (pIVar8->IO).InputCharacters[0xd] = 0;
    (pIVar8->IO).InputCharacters[0xe] = 0;
    (pIVar8->IO).InputCharacters[0xf] = 0;
    *(undefined8 *)((pIVar8->IO).InputCharacters + 0x10) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 6) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0xe) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x16) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x3e) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x46) = 0;
    (pIVar8->IO).NavInputs[0x13] = 0.0;
    (pIVar8->IO).NavInputs[0x14] = 0.0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x1e) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x26) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x2e) = 0;
    *(undefined8 *)((long)(pIVar8->IO).NavInputs + 0x36) = 0;
    pIVar8->FrameCountEnded = pIVar8->FrameCount;
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);                       // Forgot to call ImGui::NewFrame()
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f)
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit "Debug" window if it hasn't been used
    IM_ASSERT(g.CurrentWindowStack.Size == 1);    // Mismatched Begin()/End() calls, did you forget to call end on g.CurrentWindow->Name?
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    if (g.ActiveId == 0 && g.HoveredId == 0)
    {
        if (!g.NavWindow || !g.NavWindow->Appearing) // Unless we just made a window/popup appear
        {
            // Click to focus window and start moving (after we're done with all our widgets)
            if (g.IO.MouseClicked[0])
            {
                if (g.HoveredRootWindow != NULL)
                {
                    // Set ActiveId even if the _NoMove flag is set, without it dragging away from a window with _NoMove would activate hover on other windows.
                    FocusWindow(g.HoveredWindow);
                    SetActiveID(g.HoveredWindow->MoveId, g.HoveredWindow);
                    g.NavDisableHighlight = true;
                    g.ActiveIdClickOffset = g.IO.MousePos - g.HoveredRootWindow->Pos;
                    if (!(g.HoveredWindow->Flags & ImGuiWindowFlags_NoMove) && !(g.HoveredRootWindow->Flags & ImGuiWindowFlags_NoMove))
                        g.MovingWindow = g.HoveredWindow;
                }
                else if (g.NavWindow != NULL && GetFrontMostPopupModal() == NULL)
                {
                    // Clicking on void disable focus
                    FocusWindow(NULL);
                }
            }

            // With right mouse button we close popups without changing focus
            // (The left mouse button path calls FocusWindow which will lead NewFrame->ClosePopupsOverWindow to trigger)
            if (g.IO.MouseClicked[1])
            {
                // Find the top-most window between HoveredWindow and the front most Modal Window.
                // This is where we can trim the popup stack.
                ImGuiWindow* modal = GetFrontMostPopupModal();
                bool hovered_window_above_modal = false;
                if (modal == NULL)
                    hovered_window_above_modal = true;
                for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
                {
                    ImGuiWindow* window = g.Windows[i];
                    if (window == modal)
                        break;
                    if (window == g.HoveredWindow)
                        hovered_window_above_modal = true;
                }
                ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal);
            }
        }
    }

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortedBuffer(&g.WindowsSortBuffer, window);
    }

    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);  // we done something wrong
    g.Windows.swap(g.WindowsSortBuffer);

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    memset(g.IO.InputCharacters, 0, sizeof(g.IO.InputCharacters));
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    g.FrameCountEnded = g.FrameCount;
}